

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O3

uint64_t roaring64_bitmap_range_cardinality(roaring64_bitmap_t *r,uint64_t min,uint64_t max)

{
  ushort uVar1;
  uint uVar2;
  art_val_t *paVar3;
  art_key_chunk_t aVar4;
  int iVar5;
  int iVar6;
  ushort x;
  long lVar7;
  ushort x_00;
  run_container_t *prVar8;
  uint64_t uVar9;
  uint8_t max_high48 [6];
  uint8_t min_high48 [6];
  art_iterator_t it;
  uint local_c8;
  ushort local_c4;
  uint local_c0;
  ushort local_bc;
  art_iterator_t local_b8;
  
  if (min < max) {
    local_c0 = (uint)(byte)(min >> 0x38) | ((uint)(min >> 0x20) & 0xff0000) >> 8 |
               (uint)(min >> 0x18) & 0xff0000 | (uint)(min >> 8) & 0xff000000;
    local_bc = (ushort)(min >> 0x18) & 0xff | (ushort)(min >> 8) & 0xff00;
    lVar7 = max - 1;
    local_c8 = (uint)(byte)((ulong)lVar7 >> 0x38) | ((uint)((ulong)lVar7 >> 0x20) & 0xff0000) >> 8 |
               (uint)((ulong)lVar7 >> 0x18) & 0xff0000 | (uint)((ulong)lVar7 >> 8) & 0xff000000;
    local_c4 = (ushort)((ulong)lVar7 >> 0x18) & 0xff | (ushort)((ulong)lVar7 >> 8) & 0xff00;
    art_lower_bound(&local_b8,&r->art,(art_key_chunk_t *)&local_c0);
    if (local_b8.value != (art_val_t *)0x0) {
      x_00 = (short)min - 1;
      uVar9 = 0;
      x = (ushort)lVar7;
      do {
        iVar5 = art_compare_keys(local_b8.key,(art_key_chunk_t *)&local_c8);
        paVar3 = local_b8.value;
        if (0 < iVar5) {
          return uVar9;
        }
        prVar8 = *(run_container_t **)(local_b8.value[1].key + 2);
        aVar4 = local_b8.value[1].key[0];
        if (iVar5 == 0) {
          if (aVar4 == '\x04') {
            aVar4 = *(art_key_chunk_t *)&prVar8->runs;
            prVar8 = *(run_container_t **)prVar8;
          }
          if (aVar4 == '\x03') {
            iVar5 = run_container_rank(prVar8,x);
          }
          else if (aVar4 == '\x02') {
            if (prVar8->n_runs < 1) {
              iVar5 = 0;
            }
            else {
              iVar5 = prVar8->n_runs + -1;
              iVar6 = 0;
              do {
                uVar2 = (uint)(iVar5 + iVar6) >> 1;
                uVar1 = *(ushort *)
                         ((long)&prVar8->runs->value + (ulong)(iVar5 + iVar6 & 0xfffffffe));
                if (uVar1 < x) {
                  iVar6 = uVar2 + 1;
                }
                else {
                  if (uVar1 <= x) {
                    iVar5 = uVar2 + 1;
                    goto LAB_0010b05b;
                  }
                  iVar5 = uVar2 - 1;
                }
              } while (iVar6 <= iVar5);
              iVar5 = -iVar6;
              if (0 < iVar6) {
                iVar5 = iVar6;
              }
            }
          }
          else {
            iVar5 = bitset_container_rank((bitset_container_t *)prVar8,x);
          }
        }
        else {
          if (aVar4 == '\x04') {
            aVar4 = *(art_key_chunk_t *)&prVar8->runs;
            prVar8 = *(run_container_t **)prVar8;
          }
          if (aVar4 == '\x03') {
            iVar5 = run_container_cardinality(prVar8);
          }
          else {
            iVar5 = prVar8->n_runs;
          }
        }
LAB_0010b05b:
        uVar9 = uVar9 + (long)iVar5;
        iVar5 = art_compare_keys(local_b8.key,(art_key_chunk_t *)&local_c0);
        if (((short)min != 0) && (iVar5 == 0)) {
          prVar8 = *(run_container_t **)(paVar3[1].key + 2);
          aVar4 = paVar3[1].key[0];
          if (aVar4 == '\x04') {
            aVar4 = *(art_key_chunk_t *)&prVar8->runs;
            prVar8 = *(run_container_t **)prVar8;
          }
          if (aVar4 == '\x03') {
            iVar5 = run_container_rank(prVar8,x_00);
          }
          else if (aVar4 == '\x02') {
            if (prVar8->n_runs < 1) {
              iVar5 = 0;
            }
            else {
              iVar5 = prVar8->n_runs + -1;
              iVar6 = 0;
              do {
                uVar2 = (uint)(iVar5 + iVar6) >> 1;
                uVar1 = *(ushort *)
                         ((long)&prVar8->runs->value + (ulong)(iVar5 + iVar6 & 0xfffffffe));
                if (uVar1 < x_00) {
                  iVar6 = uVar2 + 1;
                }
                else {
                  if (uVar1 <= x_00) {
                    iVar5 = uVar2 + 1;
                    goto LAB_0010b0e6;
                  }
                  iVar5 = uVar2 - 1;
                }
              } while (iVar6 <= iVar5);
              iVar5 = -iVar6;
              if (0 < iVar6) {
                iVar5 = iVar6;
              }
            }
          }
          else {
            iVar5 = bitset_container_rank((bitset_container_t *)prVar8,x_00);
          }
LAB_0010b0e6:
          uVar9 = uVar9 - (long)iVar5;
        }
        art_iterator_next(&local_b8);
        if (local_b8.value == (art_val_t *)0x0) {
          return uVar9;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

uint64_t roaring64_bitmap_range_cardinality(const roaring64_bitmap_t *r,
                                            uint64_t min, uint64_t max) {
    if (min >= max) {
        return 0;
    }
    max--;  // A closed range is easier to work with.

    uint64_t cardinality = 0;
    uint8_t min_high48[ART_KEY_BYTES];
    uint16_t min_low16 = split_key(min, min_high48);
    uint8_t max_high48[ART_KEY_BYTES];
    uint16_t max_low16 = split_key(max, max_high48);

    art_iterator_t it = art_lower_bound(&r->art, min_high48);
    while (it.value != NULL) {
        int max_compare_result = compare_high48(it.key, max_high48);
        if (max_compare_result > 0) {
            // We're outside the range.
            break;
        }

        leaf_t *leaf = (leaf_t *)it.value;
        if (max_compare_result == 0) {
            // We're at the max high key, add only the range up to the low
            // 16 bits of max.
            cardinality +=
                container_rank(leaf->container, leaf->typecode, max_low16);
        } else {
            // We're not yet at the max high key, add the full container
            // range.
            cardinality +=
                container_get_cardinality(leaf->container, leaf->typecode);
        }
        if (compare_high48(it.key, min_high48) == 0 && min_low16 > 0) {
            // We're at the min high key, remove the range up to the low 16
            // bits of min.
            cardinality -=
                container_rank(leaf->container, leaf->typecode, min_low16 - 1);
        }
        art_iterator_next(&it);
    }
    return cardinality;
}